

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

int run_test_getsockname_udp(void)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = udp_listener();
  if (iVar1 == 0) {
    udp_sender();
    uv_run(loop,0);
    if ((long)getsocknamecount_udp != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
              ,0x163,"2","==","getsocknamecount_udp",2,"==",(long)getsocknamecount_udp);
      abort();
    }
    if (udp.send_queue_size != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
              ,0x165,"udp.send_queue_size","==","0",udp.send_queue_size,"==",0);
      abort();
    }
    if (udpServer.send_queue_size != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
              ,0x166,"udpServer.send_queue_size","==","0",udpServer.send_queue_size,"==",0);
      abort();
    }
    close_loop(loop);
    iVar1 = uv_loop_close(loop);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-getsockname.c"
              ,0x168,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    eval_a._4_4_ = 0;
  }
  else {
    eval_a._4_4_ = 1;
  }
  return eval_a._4_4_;
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, getsocknamecount_udp);

  ASSERT_OK(udp.send_queue_size);
  ASSERT_OK(udpServer.send_queue_size);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}